

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_writer.c
# Opt level: O3

AvxVideoWriter * aom_video_writer_open(char *filename,AvxContainer container,AvxVideoInfo *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  AvxVideoWriter *pAVar4;
  undefined7 in_register_00000031;
  aom_codec_enc_cfg local_3a0;
  
  if (((int)CONCAT71(in_register_00000031,container) == 0) &&
     (__stream = fopen64(filename,"wb"), __stream != (FILE *)0x0)) {
    pAVar4 = (AvxVideoWriter *)malloc(0x28);
    if (pAVar4 != (AvxVideoWriter *)0x0) {
      pAVar4->frame_count = 0;
      iVar1 = info->frame_width;
      iVar2 = info->frame_height;
      iVar3 = (info->time_base).numerator;
      (pAVar4->info).codec_fourcc = info->codec_fourcc;
      (pAVar4->info).frame_width = iVar1;
      (pAVar4->info).frame_height = iVar2;
      (pAVar4->info).time_base.numerator = iVar3;
      *(undefined8 *)&(pAVar4->info).time_base.denominator =
           *(undefined8 *)&(info->time_base).denominator;
      pAVar4->file = (FILE *)__stream;
      local_3a0.g_w = info->frame_width;
      local_3a0.g_h = info->frame_height;
      local_3a0.g_timebase.num = (info->time_base).numerator;
      local_3a0.g_timebase.den = (info->time_base).denominator;
      ivf_write_file_header((FILE *)__stream,&local_3a0,info->codec_fourcc,0);
      return pAVar4;
    }
    fclose(__stream);
  }
  return (AvxVideoWriter *)0x0;
}

Assistant:

AvxVideoWriter *aom_video_writer_open(const char *filename,
                                      AvxContainer container,
                                      const AvxVideoInfo *info) {
  if (container == kContainerIVF) {
    AvxVideoWriter *writer = NULL;
    FILE *const file = fopen(filename, "wb");
    if (!file) return NULL;

    writer = malloc(sizeof(*writer));
    if (!writer) {
      fclose(file);
      return NULL;
    }
    writer->frame_count = 0;
    writer->info = *info;
    writer->file = file;

    write_header(writer->file, info, 0);

    return writer;
  }

  return NULL;
}